

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::HandleTable::Resize(HandleTable *this)

{
  uint uVar1;
  uint uVar2;
  LRUHandle **ppLVar3;
  LRUHandle *pLVar4;
  LRUHandle *pLVar5;
  uint uVar6;
  LRUHandle **__s;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar1 = this->elems_;
  uVar2 = 4;
  do {
    uVar6 = uVar2;
    uVar2 = uVar6 * 2;
  } while (uVar6 < uVar1);
  __s = (LRUHandle **)operator_new__((ulong)uVar6 << 3);
  uVar9 = 0;
  memset(__s,0,(ulong)uVar6 << 3);
  uVar2 = this->length_;
  if ((ulong)uVar2 != 0) {
    ppLVar3 = this->list_;
    uVar7 = 0;
    uVar9 = 0;
    do {
      pLVar5 = ppLVar3[uVar7];
      while (pLVar5 != (LRUHandle *)0x0) {
        pLVar4 = pLVar5->next_hash;
        uVar8 = pLVar5->hash & uVar6 - 1;
        pLVar5->next_hash = __s[uVar8];
        __s[uVar8] = pLVar5;
        uVar9 = uVar9 + 1;
        pLVar5 = pLVar4;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
  }
  if (uVar1 != uVar9) {
    __assert_fail("elems_ == count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                  ,0x8f,"void leveldb::(anonymous namespace)::HandleTable::Resize()");
  }
  if (this->list_ != (LRUHandle **)0x0) {
    operator_delete__(this->list_);
  }
  this->list_ = __s;
  this->length_ = uVar6;
  return;
}

Assistant:

void Resize() {
    uint32_t new_length = 4;
    while (new_length < elems_) {
      new_length *= 2;
    }
    LRUHandle** new_list = new LRUHandle*[new_length];
    memset(new_list, 0, sizeof(new_list[0]) * new_length);
    uint32_t count = 0;
    for (uint32_t i = 0; i < length_; i++) {
      LRUHandle* h = list_[i];
      while (h != nullptr) {
        LRUHandle* next = h->next_hash;
        uint32_t hash = h->hash;
        LRUHandle** ptr = &new_list[hash & (new_length - 1)];
        h->next_hash = *ptr;
        *ptr = h;
        h = next;
        count++;
      }
    }
    assert(elems_ == count);
    delete[] list_;
    list_ = new_list;
    length_ = new_length;
  }